

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<const_kj::FsNode> __thiscall kj::anon_unknown_8::DiskFile::cloneFsNode(DiskFile *this)

{
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode> OVar1;
  AutoCloseFd local_30;
  Own<kj::(anonymous_namespace)::DiskFile> local_28;
  
  DiskHandle::clone((DiskHandle *)&local_30,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  heap<kj::(anonymous_namespace)::DiskFile,kj::AutoCloseFd>((kj *)&local_28,&local_30);
  (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)local_28.disposer;
  (this->super_DiskHandle).fd = (AutoCloseFd)local_28.ptr;
  local_28.ptr = (DiskFile *)0x0;
  Own<kj::(anonymous_namespace)::DiskFile>::~Own(&local_28);
  AutoCloseFd::~AutoCloseFd(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    return DiskHandle::read(offset, buffer);
  }